

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

void slang::ast::addSubroutineDrivers(Symbol *procedure,SubroutineSymbol *sub,Expression *callExpr)

{
  bool bVar1;
  undefined8 in_RSI;
  DriverVisitor visitor;
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  visitedSubs;
  locator loc;
  size_t pos0;
  size_t hash;
  SubroutineSymbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SubroutineSymbol **in_stack_fffffffffffffd08;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  Statement *in_stack_fffffffffffffd20;
  Symbol *in_stack_fffffffffffffd28;
  DriverVisitor *in_stack_fffffffffffffd30;
  SubroutineSymbol **in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  *in_stack_fffffffffffffd80;
  SubroutineSymbol *in_stack_fffffffffffffdd8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_1d8;
  undefined8 local_1c0 [6];
  undefined1 local_190 [16];
  size_t local_180;
  ulong local_168;
  ulong local_160;
  undefined8 local_148;
  undefined8 *local_138;
  undefined1 *local_130;
  undefined8 *local_128;
  undefined1 *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::SubroutineSymbol_*>
  local_a0;
  size_t local_88;
  size_t local_80;
  Symbol *local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Symbol *local_10;
  undefined1 *local_8;
  
  local_148 = in_RSI;
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  ::SmallSet((SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
              *)in_stack_fffffffffffffd20);
  local_1c0[0] = local_148;
  local_138 = local_1c0;
  local_130 = local_190;
  local_128 = local_138;
  local_120 = local_190;
  local_70 = local_138;
  local_68 = local_190;
  local_78 = (Symbol *)
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
             ::key_from<slang::ast::SubroutineSymbol_const*>((SubroutineSymbol **)0x9e3496);
  local_80 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
             ::hash_for<slang::ast::SubroutineSymbol_const*>
                       (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  local_88 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
             ::position_for(in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
  local_10 = local_78;
  local_20 = local_80;
  local_18 = local_88;
  local_8 = local_190;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_88);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<const_slang::ast::SubroutineSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
               ::groups((table_arrays<const_slang::ast::SubroutineSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                         *)0x9e3578);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                       (size_t)in_stack_fffffffffffffd10);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<const_slang::ast::SubroutineSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                 ::elements((table_arrays<const_slang::ast::SubroutineSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                             *)0x9e35d1);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffd20 =
             (Statement *)
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                     *)0x9e3621);
        in_stack_fffffffffffffd28 = local_10;
        in_stack_fffffffffffffd30 =
             (DriverVisitor *)
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
             ::key_from<slang::ast::SubroutineSymbol_const*>((SubroutineSymbol **)0x9e364b);
        bVar1 = std::equal_to<const_slang::ast::SubroutineSymbol_*>::operator()
                          ((equal_to<const_slang::ast::SubroutineSymbol_*> *)
                           in_stack_fffffffffffffd20,(SubroutineSymbol **)in_stack_fffffffffffffd28,
                           (SubroutineSymbol **)in_stack_fffffffffffffd30);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::SubroutineSymbol_*>
          ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
          goto LAB_009e3752;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    in_stack_fffffffffffffd1f =
         boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
         is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
    if ((bool)in_stack_fffffffffffffd1f) break;
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,local_180);
    if (!bVar1) {
      memset(&local_a0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::SubroutineSymbol_*>
      ::table_locator(&local_a0);
LAB_009e3752:
      bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_a0);
      if (bVar1) {
        local_b0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                   ::make_iterator((locator *)0x9e3774);
        local_b1 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_1d8,&local_b0,&local_b1);
      }
      else if (local_160 < local_168) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
        ::unchecked_emplace_at<slang::ast::SubroutineSymbol_const*>
                  ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                    *)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                   (size_t)in_stack_fffffffffffffd20,
                   (SubroutineSymbol **)
                   CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
        local_c8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                   ::make_iterator((locator *)0x9e37f6);
        local_e1[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_1d8,&local_c8,local_e1);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
        ::unchecked_emplace_with_rehash<slang::ast::SubroutineSymbol_const*>
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
        local_f8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                   ::make_iterator((locator *)0x9e385e);
        local_111[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_1d8,&local_f8,local_111);
      }
      DriverVisitor::DriverVisitor
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                 (SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                  *)in_stack_fffffffffffffd20,
                 (SubroutineSymbol *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                 (Expression *)in_stack_fffffffffffffd10);
      SubroutineSymbol::getBody(in_stack_fffffffffffffdd8);
      Statement::visit<slang::ast::DriverVisitor&>
                (in_stack_fffffffffffffd20,
                 (DriverVisitor *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      DriverVisitor::~DriverVisitor((DriverVisitor *)0x9e38f4);
      SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
      ::~SmallSet((SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                   *)0x9e3901);
      return;
    }
  }
  memset(&local_a0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::SubroutineSymbol_*>
  ::table_locator(&local_a0);
  goto LAB_009e3752;
}

Assistant:

static void addSubroutineDrivers(const Symbol& procedure, const SubroutineSymbol& sub,
                                 const Expression& callExpr) {
    SmallSet<const SubroutineSymbol*, 4> visitedSubs;
    visitedSubs.emplace(&sub);

    DriverVisitor visitor(procedure, visitedSubs, sub, callExpr);
    sub.getBody().visit(visitor);
}